

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

void rehash(st_table *table)

{
  uint uVar1;
  st_table_entry **__ptr;
  st_table_entry *psVar2;
  ulong uVar3;
  uint uVar4;
  st_table_entry **ppsVar5;
  ulong uVar6;
  st_table_entry *psVar7;
  ulong uVar8;
  
  uVar1 = table->num_bins;
  uVar4 = new_size(uVar1 + 1);
  if (0 < (int)uVar4) {
    ppsVar5 = (st_table_entry **)calloc((ulong)uVar4,8);
    if (ppsVar5 != (st_table_entry **)0x0) {
      uVar6 = 0;
      uVar8 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar8 = uVar6;
      }
      __ptr = table->bins;
      for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
        psVar7 = __ptr[uVar6];
        while (psVar7 != (st_table_entry *)0x0) {
          psVar2 = psVar7->next;
          uVar3 = (ulong)psVar7->hash % (ulong)uVar4;
          psVar7->next = ppsVar5[uVar3];
          ppsVar5[uVar3] = psVar7;
          psVar7 = psVar2;
        }
      }
      free(__ptr);
      table->num_bins = uVar4;
      table->bins = ppsVar5;
    }
  }
  return;
}

Assistant:

static void
rehash(register st_table* table)
{
  register st_table_entry *ptr, *next, **new_bins;
  int i, new_num_bins, old_num_bins;
  unsigned int hash_val;

  old_num_bins = table->num_bins;
  new_num_bins = new_size(old_num_bins + 1);
  if (new_num_bins <= 0) return ;

  new_bins = (st_table_entry**)Calloc(new_num_bins, sizeof(st_table_entry*));
  if (new_bins == 0) {
    return ;
  }

  for(i = 0; i < old_num_bins; i++) {
    ptr = table->bins[i];
    while (ptr != 0) {
	    next = ptr->next;
	    hash_val = ptr->hash % new_num_bins;
	    ptr->next = new_bins[hash_val];
	    new_bins[hash_val] = ptr;
	    ptr = next;
    }
  }
  free(table->bins);
  table->num_bins = new_num_bins;
  table->bins = new_bins;
}